

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Index __thiscall wabt::interp::Store::CopyRoot(Store *this,Index index)

{
  Index IVar1;
  Ref obj_index;
  Ref local_8;
  
  local_8.index =
       (this->roots_).list_.
       super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
       super__Vector_impl_data._M_start[index].index;
  if (-1 < (long)local_8.index) {
    IVar1 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&this->roots_,&local_8);
    return IVar1;
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Ref>::Get(Index) [T = wabt::interp::Ref]");
}

Assistant:

Store::RootList::Index Store::CopyRoot(RootList::Index index) {
  // roots_.Get() returns a reference to an element in an internal vector, and
  // roots_.New() might forward its arguments to emplace_back on the same
  // vector. This seems to "work" in most environments, but fails on Visual
  // Studio 2015 Win64. Copying it to a value fixes the issue.
  auto obj_index = roots_.Get(index);
  return roots_.New(obj_index);
}